

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool __thiscall cmCTestTestHandler::ProcessOptions(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  string *psVar5;
  optional<unsigned_long> level;
  optional<unsigned_long> level_00;
  allocator<char> local_989;
  string local_988;
  cmValue local_968;
  allocator<char> local_959;
  string local_958;
  string *local_938;
  allocator<char> local_929;
  string local_928;
  string *local_908;
  allocator<char> local_8f9;
  string local_8f8;
  string *local_8d8;
  allocator<char> local_8c9;
  string local_8c8;
  string *local_8a8;
  allocator<char> local_899;
  string local_898;
  string *local_878;
  allocator<char> local_869;
  string local_868;
  string *local_848;
  allocator<char> local_839;
  string local_838;
  string *local_818;
  allocator<char> local_809;
  string local_808;
  cmValue local_7e8;
  cmValue val;
  string local_7d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7b8;
  allocator<char> local_799;
  string local_798;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_778;
  allocator<char> local_759;
  string local_758;
  cmValue local_738;
  optional<unsigned_long> local_730;
  string local_720 [32];
  ostringstream local_700 [8];
  ostringstream cmCTestLog_msg_1;
  unsigned_long local_588;
  unsigned_long plevel;
  optional<unsigned_long> local_578;
  allocator<char> local_561;
  string local_560;
  cmValue local_540;
  cmValue parallelLevel;
  string local_530 [32];
  undefined1 local_510 [8];
  ostringstream cmCTestLog_msg;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_378;
  string *mode;
  unsigned_long n;
  string *local_348;
  string *count;
  RegularExpression repeatRegex;
  string local_108;
  cmValue local_e8;
  cmValue repeat;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  cmValue local_90;
  allocator<char> local_81;
  string local_80;
  cmValue local_60 [3];
  allocator<char> local_41;
  string local_40;
  string *local_20;
  cmCTestTestHandler *local_18;
  cmCTestTestHandler *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"TestsToRunInformation",&local_41);
  local_20 = (string *)
             cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_40);
  SetTestsToRunInformation(this,(cmValue)local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"UseUnion",&local_81);
  local_60[0] = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_80);
  bVar2 = cmValue::IsOn(local_60);
  SetUseUnion(this,bVar2);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"ScheduleRandom",&local_b1)
  ;
  local_90 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_b0);
  bVar2 = cmValue::IsOn(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  if (bVar2) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"Random",(allocator<char> *)((long)&repeat.Value + 7));
    cmCTest::SetScheduleType(pcVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&repeat.Value + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Repeat",(allocator<char> *)&repeatRegex.field_0x22f);
  local_e8 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&repeatRegex.field_0x22f);
  bVar2 = cmValue::operator_cast_to_bool(&local_e8);
  if (bVar2) {
    cmsys::RegularExpression::RegularExpression
              ((RegularExpression *)&count,"^(UNTIL_FAIL|UNTIL_PASS|AFTER_TIMEOUT):([0-9]+)$");
    psVar5 = cmValue::operator*[abi_cxx11_(&local_e8);
    bVar2 = cmsys::RegularExpression::find((RegularExpression *)&count,psVar5);
    if (bVar2) {
      cmsys::RegularExpression::match_abi_cxx11_((string *)&n,(RegularExpression *)&count,2);
      local_348 = (string *)&n;
      mode = (string *)0x1;
      cmStrToULong(local_348,(unsigned_long *)&mode);
      this->RepeatCount = (int)mode;
      if (1 < this->RepeatCount) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_398,(RegularExpression *)&count,1);
        local_378 = &local_398;
        bVar2 = std::operator==(local_378,"UNTIL_FAIL");
        if (bVar2) {
          this->RepeatMode = UntilFail;
        }
        else {
          bVar2 = std::operator==(local_378,"UNTIL_PASS");
          if (bVar2) {
            this->RepeatMode = UntilPass;
          }
          else {
            bVar2 = std::operator==(local_378,"AFTER_TIMEOUT");
            if (bVar2) {
              this->RepeatMode = AfterTimeout;
            }
          }
        }
        std::__cxx11::string::~string((string *)&local_398);
      }
      std::__cxx11::string::~string((string *)&n);
      parallelLevel.Value._4_4_ = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_510);
      poVar3 = std::operator<<((ostream *)local_510,"Repeat option invalid value: ");
      psVar5 = cmValue::operator*[abi_cxx11_(&local_e8);
      poVar3 = std::operator<<(poVar3,(string *)psVar5);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x225,pcVar4,false);
      std::__cxx11::string::~string(local_530);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_510);
      this_local._7_1_ = 0;
      parallelLevel.Value._4_4_ = 1;
    }
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)&count);
    if (parallelLevel.Value._4_4_ != 0) goto LAB_00308b2f;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"ParallelLevel",&local_561);
  local_540 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  bVar2 = cmValue::operator_cast_to_bool(&local_540);
  if (bVar2) {
    bVar2 = cmValue::IsEmpty(&local_540);
    if (bVar2) {
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::optional<unsigned_long>::optional(&local_578);
      level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._9_7_ = 0;
      level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           local_578.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged =
           local_578.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_engaged;
      cmCTest::SetParallelLevel(pcVar1,level);
    }
    else {
      local_588 = 0;
      psVar5 = cmValue::operator*[abi_cxx11_(&local_540);
      bVar2 = cmStrToULong(psVar5,&local_588);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_700);
        poVar3 = std::operator<<((ostream *)local_700,"ParallelLevel invalid value: ");
        psVar5 = cmValue::operator*[abi_cxx11_(&local_540);
        poVar3 = std::operator<<(poVar3,(string *)psVar5);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x233,pcVar4,false);
        std::__cxx11::string::~string(local_720);
        std::__cxx11::ostringstream::~ostringstream(local_700);
        this_local._7_1_ = 0;
        goto LAB_00308b2f;
      }
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::optional<unsigned_long>::optional<unsigned_long_&,_true>(&local_730,&local_588);
      level_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._9_7_ = 0;
      level_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           local_730.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      level_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged =
           local_730.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_engaged;
      cmCTest::SetParallelLevel(pcVar1,level_00);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,"StopOnFailure",&local_759);
  local_738 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_758);
  bVar2 = cmValue::operator_cast_to_bool(&local_738);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator(&local_759);
  if (bVar2) {
    cmCTest::SetStopOnFailure((this->super_cmCTestGenericHandler).CTest,true);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,"LabelRegularExpression",&local_799);
  cmCTestGenericHandler::GetMultiOption(&local_778,&this->super_cmCTestGenericHandler,&local_798);
  BuildLabelRE(&local_778,&this->IncludeLabelRegularExpressions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_778);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"ExcludeLabelRegularExpression",
             (allocator<char> *)((long)&val.Value + 7));
  cmCTestGenericHandler::GetMultiOption(&local_7b8,&this->super_cmCTestGenericHandler,&local_7d8);
  BuildLabelRE(&local_7b8,&this->ExcludeLabelRegularExpressions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_7b8);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&val.Value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_808,"IncludeRegularExpression",&local_809);
  local_7e8 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_808);
  std::__cxx11::string::~string((string *)&local_808);
  std::allocator<char>::~allocator(&local_809);
  bVar2 = cmValue::operator_cast_to_bool(&local_7e8);
  if (bVar2) {
    UseIncludeRegExp(this);
    psVar5 = cmValue::operator*[abi_cxx11_(&local_7e8);
    SetIncludeRegExp(this,psVar5);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_838,"ExcludeRegularExpression",&local_839);
  local_818 = (string *)
              cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_838);
  local_7e8 = (cmValue)local_818;
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  bVar2 = cmValue::operator_cast_to_bool(&local_7e8);
  if (bVar2) {
    UseExcludeRegExp(this);
    psVar5 = cmValue::operator*[abi_cxx11_(&local_7e8);
    SetExcludeRegExp(this,psVar5);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_868,"ExcludeFixtureRegularExpression",&local_869);
  local_848 = (string *)
              cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_868);
  local_7e8 = (cmValue)local_848;
  std::__cxx11::string::~string((string *)&local_868);
  std::allocator<char>::~allocator(&local_869);
  bVar2 = cmValue::operator_cast_to_bool(&local_7e8);
  if (bVar2) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_7e8);
    std::__cxx11::string::operator=((string *)&this->ExcludeFixtureRegExp,(string *)psVar5);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_898,"ExcludeFixtureSetupRegularExpression",&local_899);
  local_878 = (string *)
              cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_898);
  local_7e8 = (cmValue)local_878;
  std::__cxx11::string::~string((string *)&local_898);
  std::allocator<char>::~allocator(&local_899);
  bVar2 = cmValue::operator_cast_to_bool(&local_7e8);
  if (bVar2) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_7e8);
    std::__cxx11::string::operator=((string *)&this->ExcludeFixtureSetupRegExp,(string *)psVar5);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"ExcludeFixtureCleanupRegularExpression",&local_8c9);
  local_8a8 = (string *)
              cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_8c8);
  local_7e8 = (cmValue)local_8a8;
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator(&local_8c9);
  bVar2 = cmValue::operator_cast_to_bool(&local_7e8);
  if (bVar2) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_7e8);
    std::__cxx11::string::operator=((string *)&this->ExcludeFixtureCleanupRegExp,(string *)psVar5);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f8,"ResourceSpecFile",&local_8f9);
  local_8d8 = (string *)
              cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_8f8);
  local_7e8 = (cmValue)local_8d8;
  std::__cxx11::string::~string((string *)&local_8f8);
  std::allocator<char>::~allocator(&local_8f9);
  bVar2 = cmValue::operator_cast_to_bool(&local_7e8);
  if (bVar2) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_7e8);
    std::__cxx11::string::operator=((string *)&this->ResourceSpecFile,(string *)psVar5);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,"TestListFile",&local_929)
  ;
  local_908 = (string *)
              cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_928);
  local_7e8 = (cmValue)local_908;
  std::__cxx11::string::~string((string *)&local_928);
  std::allocator<char>::~allocator(&local_929);
  bVar2 = cmValue::operator_cast_to_bool(&local_7e8);
  if (bVar2) {
    psVar5 = cmValue::operator_cast_to_string_(&local_7e8);
    std::__cxx11::string::operator=((string *)&this->TestListFile,(string *)psVar5);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_958,"ExcludeTestListFile",&local_959);
  local_938 = (string *)
              cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_958);
  local_7e8 = (cmValue)local_938;
  std::__cxx11::string::~string((string *)&local_958);
  std::allocator<char>::~allocator(&local_959);
  bVar2 = cmValue::operator_cast_to_bool(&local_7e8);
  if (bVar2) {
    psVar5 = cmValue::operator_cast_to_string_(&local_7e8);
    std::__cxx11::string::operator=((string *)&this->ExcludeTestListFile,(string *)psVar5);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_988,"RerunFailed",&local_989);
  local_968 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_988);
  bVar2 = cmValue::IsOn(&local_968);
  SetRerunFailed(this,bVar2);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator(&local_989);
  this_local._7_1_ = 1;
LAB_00308b2f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestTestHandler::ProcessOptions()
{
  // Update internal data structure from generic one
  this->SetTestsToRunInformation(this->GetOption("TestsToRunInformation"));
  this->SetUseUnion(this->GetOption("UseUnion").IsOn());
  if (this->GetOption("ScheduleRandom").IsOn()) {
    this->CTest->SetScheduleType("Random");
  }
  if (cmValue repeat = this->GetOption("Repeat")) {
    cmsys::RegularExpression repeatRegex(
      "^(UNTIL_FAIL|UNTIL_PASS|AFTER_TIMEOUT):([0-9]+)$");
    if (repeatRegex.find(*repeat)) {
      std::string const& count = repeatRegex.match(2);
      unsigned long n = 1;
      cmStrToULong(count, &n); // regex guarantees success
      this->RepeatCount = static_cast<int>(n);
      if (this->RepeatCount > 1) {
        std::string const& mode = repeatRegex.match(1);
        if (mode == "UNTIL_FAIL") {
          this->RepeatMode = cmCTest::Repeat::UntilFail;
        } else if (mode == "UNTIL_PASS") {
          this->RepeatMode = cmCTest::Repeat::UntilPass;
        } else if (mode == "AFTER_TIMEOUT") {
          this->RepeatMode = cmCTest::Repeat::AfterTimeout;
        }
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Repeat option invalid value: " << *repeat << std::endl);
      return false;
    }
  }
  if (cmValue parallelLevel = this->GetOption("ParallelLevel")) {
    if (parallelLevel.IsEmpty()) {
      // An empty value tells ctest to choose a default.
      this->CTest->SetParallelLevel(cm::nullopt);
    } else {
      // A non-empty value must be a non-negative integer.
      unsigned long plevel = 0;
      if (!cmStrToULong(*parallelLevel, &plevel)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "ParallelLevel invalid value: " << *parallelLevel
                                                   << std::endl);
        return false;
      }
      this->CTest->SetParallelLevel(plevel);
    }
  }

  if (this->GetOption("StopOnFailure")) {
    this->CTest->SetStopOnFailure(true);
  }

  BuildLabelRE(this->GetMultiOption("LabelRegularExpression"),
               this->IncludeLabelRegularExpressions);
  BuildLabelRE(this->GetMultiOption("ExcludeLabelRegularExpression"),
               this->ExcludeLabelRegularExpressions);
  cmValue val = this->GetOption("IncludeRegularExpression");
  if (val) {
    this->UseIncludeRegExp();
    this->SetIncludeRegExp(*val);
  }
  val = this->GetOption("ExcludeRegularExpression");
  if (val) {
    this->UseExcludeRegExp();
    this->SetExcludeRegExp(*val);
  }
  val = this->GetOption("ExcludeFixtureRegularExpression");
  if (val) {
    this->ExcludeFixtureRegExp = *val;
  }
  val = this->GetOption("ExcludeFixtureSetupRegularExpression");
  if (val) {
    this->ExcludeFixtureSetupRegExp = *val;
  }
  val = this->GetOption("ExcludeFixtureCleanupRegularExpression");
  if (val) {
    this->ExcludeFixtureCleanupRegExp = *val;
  }
  val = this->GetOption("ResourceSpecFile");
  if (val) {
    this->ResourceSpecFile = *val;
  }
  val = this->GetOption("TestListFile");
  if (val) {
    this->TestListFile = val;
  }
  val = this->GetOption("ExcludeTestListFile");
  if (val) {
    this->ExcludeTestListFile = val;
  }
  this->SetRerunFailed(this->GetOption("RerunFailed").IsOn());

  return true;
}